

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::fields<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *p_Var1;
  size_t sVar2;
  char *pcVar3;
  ParseDeclsCtx *pPVar4;
  bool bVar5;
  Name *pNVar6;
  Name local_258;
  Err local_248;
  Err *local_228;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Result<wasm::Ok> field_2;
  Name local_1c8;
  Err local_1b8;
  Err *local_198;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Result<wasm::Ok> field_1;
  allocator<char> local_119;
  string local_118;
  Err local_f8;
  uint local_d4;
  Err local_d0;
  Err *local_b0;
  Err *err;
  undefined1 local_98 [8];
  Result<wasm::Ok> _val;
  Result<wasm::Ok> field;
  optional<wasm::Name> id;
  Ok local_19;
  ParseDeclsCtx *pPStack_18;
  FieldsT res;
  ParseDeclsCtx *ctx_local;
  
  pPStack_18 = ctx;
  NullTypeParserCtx::makeFields((NullTypeParserCtx *)ctx);
  do {
    while( true ) {
      bVar5 = Lexer::empty(&pPStack_18->in);
      if ((bVar5) || (bVar5 = Lexer::peekRParen(&pPStack_18->in), pPVar4 = pPStack_18, bVar5)) {
        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_19);
        return __return_storage_ptr__;
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged,"field");
      bVar5 = Lexer::takeSExprStart(&pPVar4->in,stack0xffffffffffffffd0);
      if (!bVar5) break;
      Lexer::takeID((optional<wasm::Name> *)
                    ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&pPStack_18->in);
      bVar5 = std::optional::operator_cast_to_bool
                        ((optional *)
                         ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      if (bVar5) {
        p_Var1 = (__index_type *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
        fieldtype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,pPStack_18);
        Result<wasm::Ok>::Result((Result<wasm::Ok> *)local_98,(Result<wasm::Ok> *)p_Var1);
        local_b0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_98);
        bVar5 = local_b0 != (Err *)0x0;
        if (bVar5) {
          wasm::Err::Err(&local_d0,local_b0);
          Result<wasm::Ok>::Result(__return_storage_ptr__,&local_d0);
          wasm::Err::~Err(&local_d0);
        }
        local_d4 = (uint)bVar5;
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_98);
        if (local_d4 == 0) {
          bVar5 = Lexer::takeRParen(&pPStack_18->in);
          pPVar4 = pPStack_18;
          if (bVar5) {
            pNVar6 = std::optional<wasm::Name>::operator*
                               ((optional<wasm::Name> *)
                                ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            sVar2 = (pNVar6->super_IString).str._M_len;
            pcVar3 = (pNVar6->super_IString).str._M_str;
            Result<wasm::Ok>::operator*
                      ((Result<wasm::Ok> *)
                       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            NullTypeParserCtx::appendField((NullTypeParserCtx *)pPVar4,&local_19,sVar2,pcVar3);
            local_d4 = 0;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_118,"expected end of field",&local_119);
            Lexer::err(&local_f8,&pPVar4->in,&local_118);
            Result<wasm::Ok>::Result(__return_storage_ptr__,&local_f8);
            wasm::Err::~Err(&local_f8);
            std::__cxx11::string::~string((string *)&local_118);
            std::allocator<char>::~allocator(&local_119);
            local_d4 = 1;
          }
        }
        Result<wasm::Ok>::~Result
                  ((Result<wasm::Ok> *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        if (local_d4 != 0) {
          return __return_storage_ptr__;
        }
      }
      else {
        while (bVar5 = Lexer::takeRParen(&pPStack_18->in), ((bVar5 ^ 0xffU) & 1) != 0) {
          p_Var1 = (__index_type *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
          fieldtype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,pPStack_18);
          Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_1,(Result<wasm::Ok> *)p_Var1);
          local_198 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
          bVar5 = local_198 != (Err *)0x0;
          if (bVar5) {
            wasm::Err::Err(&local_1b8,local_198);
            Result<wasm::Ok>::Result(__return_storage_ptr__,&local_1b8);
            wasm::Err::~Err(&local_1b8);
          }
          local_d4 = (uint)bVar5;
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
          pPVar4 = pPStack_18;
          if (local_d4 == 0) {
            wasm::Name::Name(&local_1c8);
            Result<wasm::Ok>::operator*
                      ((Result<wasm::Ok> *)
                       ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            NullTypeParserCtx::appendField
                      ((NullTypeParserCtx *)pPVar4,&local_19,local_1c8.super_IString.str._M_len,
                       local_1c8.super_IString.str._M_str);
            local_d4 = 0;
          }
          Result<wasm::Ok>::~Result
                    ((Result<wasm::Ok> *)
                     ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          if (local_d4 != 0) {
            return __return_storage_ptr__;
          }
        }
      }
    }
    p_Var1 = (__index_type *)
             ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    fieldtype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,pPStack_18);
    Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_2,(Result<wasm::Ok> *)p_Var1);
    local_228 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
    bVar5 = local_228 != (Err *)0x0;
    if (bVar5) {
      wasm::Err::Err(&local_248,local_228);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_248);
      wasm::Err::~Err(&local_248);
    }
    local_d4 = (uint)bVar5;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
    pPVar4 = pPStack_18;
    if (local_d4 == 0) {
      wasm::Name::Name(&local_258);
      Result<wasm::Ok>::operator*
                ((Result<wasm::Ok> *)
                 ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      NullTypeParserCtx::appendField
                ((NullTypeParserCtx *)pPVar4,&local_19,local_258.super_IString.str._M_len,
                 local_258.super_IString.str._M_str);
      local_d4 = 0;
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  } while (local_d4 == 0);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::FieldsT> fields(Ctx& ctx) {
  auto res = ctx.makeFields();
  while (true) {
    if (ctx.in.empty() || ctx.in.peekRParen()) {
      return res;
    }
    if (ctx.in.takeSExprStart("field")) {
      if (auto id = ctx.in.takeID()) {
        auto field = fieldtype(ctx);
        CHECK_ERR(field);
        if (!ctx.in.takeRParen()) {
          return ctx.in.err("expected end of field");
        }
        ctx.appendField(res, *id, *field);
      } else {
        while (!ctx.in.takeRParen()) {
          auto field = fieldtype(ctx);
          CHECK_ERR(field);
          ctx.appendField(res, {}, *field);
        }
      }
    } else {
      auto field = fieldtype(ctx);
      CHECK_ERR(field);
      ctx.appendField(res, {}, *field);
    }
  }
}